

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O3

adios2_error adios2_variable_count(size_t *count,adios2_variable *variable)

{
  Dims countCpp;
  void *local_78;
  long local_70;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"for const adios2_variable, in call to adios2_variable_count","");
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"for const adios2_count, in call to adios2_variable_count","");
  adios2::helper::CheckForNullptr<unsigned_long>(count,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Variable<signed_char>::Count();
    break;
  case 2:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Variable<short>::Count();
    break;
  case 3:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Variable<int>::Count();
    break;
  case 4:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Variable<long>::Count();
    break;
  case 5:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Variable<unsigned_char>::Count();
    break;
  case 6:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Variable<unsigned_short>::Count();
    break;
  case 7:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Variable<unsigned_int>::Count();
    break;
  case 8:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Variable<unsigned_long>::Count();
    break;
  case 9:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Variable<float>::Count();
    break;
  case 10:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Variable<double>::Count();
    break;
  case 0xb:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Variable<long_double>::Count();
    break;
  case 0xc:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Variable<std::complex<float>>::Count();
    break;
  case 0xd:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Variable<std::complex<double>>::Count();
    break;
  case 0xe:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Variable<std::__cxx11::string>::Count();
    break;
  case 0xf:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Variable<char>::Count();
    break;
  default:
    goto switchD_00125233_default;
  }
  if (local_70 - (long)local_78 != 0) {
    memmove(count,local_78,local_70 - (long)local_78);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78);
  }
switchD_00125233_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_count(size_t *count, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_count");
        adios2::helper::CheckForNullptr(count, "for const adios2_count, in call to "
                                               "adios2_variable_count");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        const adios2::Dims countCpp = variable->Count();                                           \
        std::copy(countCpp.begin(), countCpp.end(), count);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_count"));
    }
}